

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceListFieldsTest_OneOfTest_Test::
~NoFieldPresenceListFieldsTest_OneOfTest_Test(NoFieldPresenceListFieldsTest_OneOfTest_Test *this)

{
  NoFieldPresenceListFieldsTest_OneOfTest_Test *this_local;
  
  ~NoFieldPresenceListFieldsTest_OneOfTest_Test(this);
  operator_delete(this,0x2e0);
  return;
}

Assistant:

TEST_F(NoFieldPresenceListFieldsTest, OneOfTest) {
  // Oneof fields behave essentially like an explicit presence field.
  message_.set_oneof_uint32(0);
  r_->ListFields(message_, &fields_);
  EXPECT_EQ(1, fields_.size());

  fields_.clear();
  // Note:
  // we don't clear message_ -- oneof must only maintain one present field.
  message_.set_oneof_uint32(42);
  r_->ListFields(message_, &fields_);
  EXPECT_EQ(1, fields_.size());
}